

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subject.cpp
# Opt level: O0

void __thiscall Subject::~Subject(Subject *this)

{
  list<Observer_*,_std::allocator<Observer_*>_> *this_00;
  Subject *this_local;
  
  this->_vptr_Subject = (_func_int **)&PTR_attach_0014cbf0;
  this_00 = this->listOfObservers;
  if (this_00 != (list<Observer_*,_std::allocator<Observer_*>_> *)0x0) {
    std::__cxx11::list<Observer_*,_std::allocator<Observer_*>_>::~list(this_00);
    operator_delete(this_00,0x18);
  }
  return;
}

Assistant:

Subject::~Subject() {
delete listOfObservers;
}